

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  undefined2 *puVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  short *psVar5;
  int iVar6;
  int iVar7;
  undefined2 *puVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  size_t local_60;
  
  uVar9 = tableLog - 5;
  bVar19 = false;
  uVar13 = maxSymbolValue + 1;
  puVar8 = (undefined2 *)header;
  if (uVar13 == 0) {
    lVar4 = 1;
LAB_004becf5:
    local_60 = 0xffffffffffffffff;
    if ((bVar19) &&
       ((writeIsSafe != 0 ||
        (local_60 = 0xffffffffffffffba,
        puVar8 <= (undefined2 *)((long)header + (headerBufferSize - 2)))))) {
      *puVar8 = (short)uVar9;
      local_60 = (long)puVar8 + (lVar4 - (long)header);
    }
    return local_60;
  }
  iVar18 = 1 << ((byte)tableLog & 0x1f);
  puVar1 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar7 = 4;
  bVar19 = false;
  uVar17 = 0;
  iVar12 = tableLog + 1;
  uVar3 = iVar18 + 1;
LAB_004beb1b:
  uVar16 = uVar17;
  if (bVar19) {
    if (uVar17 < uVar13) {
      psVar5 = normalizedCounter + uVar17;
      uVar14 = uVar17;
      do {
        uVar16 = uVar14;
        if (*psVar5 != 0) break;
        uVar14 = uVar14 + 1;
        psVar5 = psVar5 + 1;
        uVar16 = uVar13;
      } while (uVar13 != uVar14);
    }
    iVar10 = 3;
    if (uVar16 != uVar13) {
      if (uVar17 + 0x18 <= uVar16) {
        uVar14 = uVar17;
        do {
          uVar9 = uVar9 + (0xffff << ((byte)iVar7 & 0x1f));
          if ((writeIsSafe == 0) && (puVar1 < puVar8)) {
            local_60 = 0xffffffffffffffba;
            iVar10 = 1;
            goto LAB_004bec0c;
          }
          *puVar8 = (short)uVar9;
          puVar8 = puVar8 + 1;
          uVar9 = uVar9 >> 0x10;
          uVar17 = uVar14 + 0x18;
          uVar15 = uVar14 + 0x30;
          uVar14 = uVar17;
        } while (uVar15 <= uVar16);
      }
      uVar14 = uVar17 + 3;
      iVar6 = iVar7;
      while (uVar14 <= uVar16) {
        uVar9 = uVar9 + (3 << ((byte)iVar6 & 0x1f));
        iVar6 = iVar6 + 2;
        uVar14 = uVar17 + 6;
        uVar17 = uVar17 + 3;
      }
      uVar9 = (uVar16 - uVar17 << ((byte)iVar6 & 0x1f)) + uVar9;
      iVar7 = iVar6 + 2;
      iVar10 = 0;
      if (0xe < iVar6) {
        if ((writeIsSafe == 0) && (puVar1 < puVar8)) {
          local_60 = 0xffffffffffffffba;
          iVar10 = 1;
        }
        else {
          *puVar8 = (short)uVar9;
          puVar8 = puVar8 + 1;
          uVar9 = uVar9 >> 0x10;
          iVar7 = iVar6 + -0xe;
          iVar10 = 0;
        }
      }
    }
LAB_004bec0c:
    if (iVar10 != 0) {
      uVar14 = uVar3;
      if (iVar10 != 3) {
        return local_60;
      }
LAB_004becd9:
      bVar19 = uVar14 == 1;
      iVar18 = iVar7 + 0xe;
      if (-1 < iVar7 + 7) {
        iVar18 = iVar7 + 7;
      }
      lVar4 = (long)(iVar18 >> 3);
      goto LAB_004becf5;
    }
  }
  iVar6 = (int)normalizedCounter[uVar16];
  iVar10 = -iVar6;
  if (0 < iVar6) {
    iVar10 = iVar6;
  }
  iVar2 = ~uVar3 + iVar18 * 2;
  iVar11 = iVar2;
  if (iVar6 + 1 < iVar18) {
    iVar11 = 0;
  }
  iVar11 = iVar11 + iVar6 + 1;
  bVar19 = iVar11 == 1;
  uVar14 = uVar3 - iVar10;
  iVar6 = iVar12;
  if (uVar14 == 0 || (int)uVar3 < iVar10) {
    local_60 = 0xffffffffffffffff;
  }
  else {
    for (; (int)uVar14 < iVar18; iVar18 = iVar18 >> 1) {
      iVar6 = iVar6 + -1;
    }
  }
  if ((int)uVar14 < 1) {
    return local_60;
  }
  uVar9 = uVar9 + (iVar11 << ((byte)iVar7 & 0x1f));
  iVar7 = (iVar7 + iVar12) - (uint)(iVar11 < iVar2);
  if (0x10 < iVar7) {
    if ((writeIsSafe == 0) && (puVar1 < puVar8)) {
      return 0xffffffffffffffba;
    }
    *puVar8 = (short)uVar9;
    puVar8 = puVar8 + 1;
    uVar9 = uVar9 >> 0x10;
    iVar7 = iVar7 + -0x10;
  }
  uVar17 = uVar16 + 1;
  if ((uVar13 <= uVar17) || (iVar12 = iVar6, uVar3 = uVar14, uVar14 == 1)) goto LAB_004becd9;
  goto LAB_004beb1b;
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}